

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kickpass.c
# Opt level: O0

kp_error_t kp_password_prompt(kp_ctx *ctx,_Bool confirm,char *password,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  byte in_SIL;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  kp_error_t ret;
  undefined1 auStack_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 local_28;
  undefined8 local_20;
  byte local_11;
  long local_10;
  kp_error_t local_4;
  
  local_38 = auStack_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_11 = in_SIL & 1;
  if (*(long *)(in_RDI + 0x110c0) == 0) {
    local_4 = 0xb;
  }
  else {
    local_40 = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x20;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    local_4 = (**(code **)(in_RDI + 0x110c0))(in_RDI,local_11,in_RDX,in_RCX,&local_48);
  }
  return local_4;
}

Assistant:

kp_error_t
kp_password_prompt(struct kp_ctx *ctx, bool confirm, char *password, const char *fmt, ...)
{
	kp_error_t ret;
	va_list ap;

	assert(ctx);

	if (ctx->password_prompt == NULL) {
		return KP_NOPROMPT;
	}

	va_start(ap, fmt);
	ret = ctx->password_prompt(ctx, confirm, password, fmt, ap);
	va_end(ap);

	return ret;
}